

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynClassStaticIf * ParseClassStaticIf(ParseContext *ctx,bool nested)

{
  LexemeType LVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  int iVar3;
  SynBase *this;
  undefined4 extraout_var;
  SynClassElements *pSVar4;
  SynClassStaticIf *pSVar5;
  undefined4 extraout_var_00;
  SynClassElements *this_00;
  undefined4 extraout_var_01;
  Lexeme *pos;
  undefined7 in_register_00000031;
  IntrusiveList<SynClassStaticIf> staticIfs;
  IntrusiveList<SynClassStaticIf> local_58;
  SynClassStaticIf *local_48;
  SynClassStaticIf *pSStack_40;
  
  begin = ctx->currentLexeme;
  if ((int)CONCAT71(in_register_00000031,nested) == 0) {
    if (begin->type != lex_at) {
      return (SynClassStaticIf *)0x0;
    }
    ctx->currentLexeme = begin + 1;
  }
  if (ctx->currentLexeme->type != lex_if) {
    ctx->currentLexeme = begin;
    return (SynClassStaticIf *)0x0;
  }
  ctx->currentLexeme = ctx->currentLexeme + 1;
  anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
  this = ParseAssignment(ctx);
  if (this == (SynBase *)0x0) {
    anon_unknown.dwarf_16d1cf::Report
              (ctx,ctx->currentLexeme,"ERROR: condition not found in \'if\' statement");
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
    this = (SynBase *)CONCAT44(extraout_var,iVar3);
    SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
  }
  anon_unknown.dwarf_16d1cf::CheckConsume
            (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
  LVar1 = ctx->currentLexeme->type;
  if (LVar1 == lex_ofigure) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
  }
  pSVar4 = ParseClassElements(ctx);
  if (LVar1 == lex_ofigure) {
    anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
  }
  pLVar2 = ctx->currentLexeme;
  if (pLVar2->type == lex_else) {
    ctx->currentLexeme = pLVar2 + 1;
    LVar1 = pLVar2[1].type;
    if (LVar1 == lex_if) {
      local_58.head = (SynClassStaticIf *)0x0;
      local_58.tail = (SynClassStaticIf *)0x0;
      pSVar5 = ParseClassStaticIf(ctx,true);
      IntrusiveList<SynClassStaticIf>::push_back(&local_58,pSVar5);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
      this_00 = (SynClassElements *)CONCAT44(extraout_var_00,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0022380f;
      local_48 = local_58.head;
      pSStack_40 = local_58.tail;
      SynBase::SynBase((SynBase *)this_00,0x3e,pLVar2 + 1,ctx->currentLexeme + -1);
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f7bd0;
      (this_00->typedefs).head = (SynTypedef *)0x0;
      (this_00->typedefs).tail = (SynTypedef *)0x0;
      (this_00->functions).head = (SynFunctionDefinition *)0x0;
      (this_00->functions).tail = (SynFunctionDefinition *)0x0;
      (this_00->accessors).head = (SynAccessor *)0x0;
      (this_00->accessors).tail = (SynAccessor *)0x0;
      (this_00->members).head = (SynVariableDefinitions *)0x0;
      (this_00->members).tail = (SynVariableDefinitions *)0x0;
      (this_00->constantSets).head = (SynConstantSet *)0x0;
      (this_00->constantSets).tail = (SynConstantSet *)0x0;
      (this_00->staticIfs).head = local_48;
      (this_00->staticIfs).tail = pSStack_40;
    }
    else {
      if (LVar1 == lex_ofigure) {
        ctx->currentLexeme = pLVar2 + 2;
      }
      this_00 = ParseClassElements(ctx);
      if (LVar1 == lex_ofigure) {
        anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_cfigure,"ERROR: closing \'}\' not found");
      }
    }
  }
  else {
    this_00 = (SynClassElements *)0x0;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  pSVar5 = (SynClassStaticIf *)CONCAT44(extraout_var_01,iVar3);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase((SynBase *)pSVar5,0x3d,begin,ctx->currentLexeme + -1);
    (pSVar5->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f8110;
    pSVar5->condition = this;
    pSVar5->trueBlock = pSVar4;
    pSVar5->falseBlock = this_00;
    return pSVar5;
  }
LAB_0022380f:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynClassStaticIf* ParseClassStaticIf(ParseContext &ctx, bool nested)
{
	Lexeme *start = ctx.currentLexeme;

	if(nested || ctx.Consume(lex_at))
	{
		if(!ctx.Consume(lex_if))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		bool hasBlock = ctx.Consume(lex_ofigure);

		SynClassElements *trueBlock = ParseClassElements(ctx);

		if(hasBlock)
			CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");

		SynClassElements *falseBlock = NULL;

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
			{
				Lexeme *pos = ctx.currentLexeme;

				IntrusiveList<SynClassStaticIf> staticIfs;

				staticIfs.push_back(ParseClassStaticIf(ctx, true));

				falseBlock = new (ctx.get<SynClassElements>()) SynClassElements(pos, ctx.Previous(), IntrusiveList<SynTypedef>(), IntrusiveList<SynFunctionDefinition>(), IntrusiveList<SynAccessor>(), IntrusiveList<SynVariableDefinitions>(), IntrusiveList<SynConstantSet>(), staticIfs);
			}
			else
			{
				hasBlock = ctx.Consume(lex_ofigure);

				falseBlock = ParseClassElements(ctx);

				if(hasBlock)
					CheckConsume(ctx, lex_cfigure, "ERROR: closing '}' not found");
			}
		}

		return new (ctx.get<SynClassStaticIf>()) SynClassStaticIf(start, ctx.Previous(), condition, trueBlock, falseBlock);
	}

	return NULL;
}